

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void sync(void)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *in_RDI;
  
  do {
    iVar2 = t->id;
    cVar1 = *in_RDI;
    pcVar3 = in_RDI + 1;
    while (cVar1 != '\0') {
      if ((iVar2 == -1) || (iVar2 == cVar1)) {
        return;
      }
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    }
    last_id = iVar2;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
  } while( true );
}

Assistant:

int sync(const char* accepted)
{
    int loop = 1;
    const char* p;
#ifndef NDEBUG
    printf("Trying to resync with one of : ");
    p = accepted;
    while (*p)
    {
        printf("'%c'", *p);
        ++p;
        if (*p)
            printf(", ");
    }
    printf("\n\tLast token : %s\n\tCurrent : %s\n", token_name(last_id), token_name(t->id));
#endif
    while (loop)
    {
        p = accepted;
        while (*p && t->id != EOF && *p != t->id)
            ++p;

        if (*p)
            loop = 0;
        else
            next();
    }
#ifndef NDEBUG
    printf("\tResult: %s found at %d:%d\n", token_name(t->id), t->line, t->column);
#endif
    return *p == t->id;
}